

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex_encoder_test.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::tools::HexEncoderTest_test_decode_from_hex_Test::TestBody
          (HexEncoderTest_test_decode_from_hex_Test *this)

{
  bool bVar1;
  reference pvVar2;
  char *pcVar3;
  AssertHelper local_298;
  Message local_290;
  allocator<char> local_281;
  string local_280 [32];
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_260;
  uchar local_241;
  undefined1 local_240 [8];
  AssertionResult gtest_ar_5;
  Message local_228;
  allocator<char> local_219;
  string local_218 [32];
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_1f8;
  uchar local_1d9;
  undefined1 local_1d8 [8];
  AssertionResult gtest_ar_4;
  Message local_1c0;
  allocator<char> local_1b1;
  string local_1b0 [32];
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_190;
  uchar local_171;
  undefined1 local_170 [8];
  AssertionResult gtest_ar_3;
  Message local_158;
  allocator<char> local_149;
  string local_148 [32];
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_128;
  uchar local_109;
  undefined1 local_108 [8];
  AssertionResult gtest_ar_2;
  Message local_f0;
  allocator<char> local_e1;
  string local_e0 [32];
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_c0;
  uchar local_a1;
  undefined1 local_a0 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_88;
  Message local_80 [3];
  allocator<char> local_61;
  string local_60 [32];
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_40;
  uchar local_21;
  undefined1 local_20 [8];
  AssertionResult gtest_ar;
  HexEncoderTest_test_decode_from_hex_Test *this_local;
  
  local_21 = '#';
  gtest_ar.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_60,"23",&local_61);
  bidfx_public_api::tools::HexEncoder::DecodeFromHex(&local_40,local_60);
  pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(&local_40,0);
  testing::internal::EqHelper<false>::Compare<unsigned_char,unsigned_char>
            ((EqHelper<false> *)local_20,"(unsigned char) 35",
             "HexEncoder::DecodeFromHex(\"23\").at(0)",&local_21,pvVar2);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_40);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator(&local_61);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(local_80);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_20);
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/hex_encoder_test.cpp"
               ,0x2d,pcVar3);
    testing::internal::AssertHelper::operator=(&local_88,local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    testing::Message::~Message(local_80);
  }
  gtest_ar_1.message_.ptr_._5_3_ = 0;
  gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
    local_a1 = '\0';
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_e0,"00",&local_e1);
    bidfx_public_api::tools::HexEncoder::DecodeFromHex(&local_c0,local_e0);
    pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(&local_c0,0);
    testing::internal::EqHelper<false>::Compare<unsigned_char,unsigned_char>
              ((EqHelper<false> *)local_a0,"(unsigned char) 0",
               "HexEncoder::DecodeFromHex(\"00\").at(0)",&local_a1,pvVar2);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_c0);
    std::__cxx11::string::~string(local_e0);
    std::allocator<char>::~allocator(&local_e1);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a0);
    if (!bVar1) {
      testing::Message::Message(&local_f0);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_a0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2.message_,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/hex_encoder_test.cpp"
                 ,0x2e,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_f0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
      testing::Message::~Message(&local_f0);
    }
    gtest_ar_1.message_.ptr_._5_3_ = 0;
    gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_a0);
    if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
      local_109 = 'V';
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_148,"56",&local_149);
      bidfx_public_api::tools::HexEncoder::DecodeFromHex(&local_128,local_148);
      pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(&local_128,0);
      testing::internal::EqHelper<false>::Compare<unsigned_char,unsigned_char>
                ((EqHelper<false> *)local_108,"(unsigned char) 86",
                 "HexEncoder::DecodeFromHex(\"56\").at(0)",&local_109,pvVar2);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_128);
      std::__cxx11::string::~string(local_148);
      std::allocator<char>::~allocator(&local_149);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_108);
      if (!bVar1) {
        testing::Message::Message(&local_158);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_108);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_3.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/hex_encoder_test.cpp"
                   ,0x2f,pcVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_158);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
        testing::Message::~Message(&local_158);
      }
      gtest_ar_1.message_.ptr_._5_3_ = 0;
      gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_108);
      if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
        local_171 = 'i';
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(local_1b0,"69",&local_1b1);
        bidfx_public_api::tools::HexEncoder::DecodeFromHex(&local_190,local_1b0);
        pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(&local_190,0);
        testing::internal::EqHelper<false>::Compare<unsigned_char,unsigned_char>
                  ((EqHelper<false> *)local_170,"(unsigned char) 105",
                   "HexEncoder::DecodeFromHex(\"69\").at(0)",&local_171,pvVar2);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_190);
        std::__cxx11::string::~string(local_1b0);
        std::allocator<char>::~allocator(&local_1b1);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_170);
        if (!bVar1) {
          testing::Message::Message(&local_1c0);
          pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_170);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_4.message_,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/hex_encoder_test.cpp"
                     ,0x30,pcVar3);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_4.message_,&local_1c0);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
          testing::Message::~Message(&local_1c0);
        }
        gtest_ar_1.message_.ptr_._5_3_ = 0;
        gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_170);
        if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
          local_1d9 = '[';
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>(local_218,"5B",&local_219);
          bidfx_public_api::tools::HexEncoder::DecodeFromHex(&local_1f8,local_218);
          pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(&local_1f8,0);
          testing::internal::EqHelper<false>::Compare<unsigned_char,unsigned_char>
                    ((EqHelper<false> *)local_1d8,"(unsigned char) 91",
                     "HexEncoder::DecodeFromHex(\"5B\").at(0)",&local_1d9,pvVar2);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_1f8);
          std::__cxx11::string::~string(local_218);
          std::allocator<char>::~allocator(&local_219);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d8);
          if (!bVar1) {
            testing::Message::Message(&local_228);
            pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1d8);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_5.message_,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/hex_encoder_test.cpp"
                       ,0x31,pcVar3);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_5.message_,&local_228);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
            testing::Message::~Message(&local_228);
          }
          gtest_ar_1.message_.ptr_._5_3_ = 0;
          gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d8);
          if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
            local_241 = 'y';
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>(local_280,"79",&local_281);
            bidfx_public_api::tools::HexEncoder::DecodeFromHex(&local_260,local_280);
            pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(&local_260,0);
            testing::internal::EqHelper<false>::Compare<unsigned_char,unsigned_char>
                      ((EqHelper<false> *)local_240,"(unsigned char) 121",
                       "HexEncoder::DecodeFromHex(\"79\").at(0)",&local_241,pvVar2);
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_260);
            std::__cxx11::string::~string(local_280);
            std::allocator<char>::~allocator(&local_281);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_240);
            if (!bVar1) {
              testing::Message::Message(&local_290);
              pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_240);
              testing::internal::AssertHelper::AssertHelper
                        (&local_298,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/hex_encoder_test.cpp"
                         ,0x32,pcVar3);
              testing::internal::AssertHelper::operator=(&local_298,&local_290);
              testing::internal::AssertHelper::~AssertHelper(&local_298);
              testing::Message::~Message(&local_290);
            }
            gtest_ar_1.message_.ptr_._5_3_ = 0;
            gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_240);
          }
        }
      }
    }
  }
  return;
}

Assistant:

TEST(HexEncoderTest, test_decode_from_hex)
{
    ASSERT_EQ((unsigned char) 35, HexEncoder::DecodeFromHex("23").at(0));
    ASSERT_EQ((unsigned char) 0, HexEncoder::DecodeFromHex("00").at(0));
    ASSERT_EQ((unsigned char) 86, HexEncoder::DecodeFromHex("56").at(0));
    ASSERT_EQ((unsigned char) 105, HexEncoder::DecodeFromHex("69").at(0));
    ASSERT_EQ((unsigned char) 91, HexEncoder::DecodeFromHex("5B").at(0));
    ASSERT_EQ((unsigned char) 121, HexEncoder::DecodeFromHex("79").at(0));
}